

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O2

monst * makedog(void)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  monst *mtmp;
  obj *otmp;
  char *pcVar6;
  int tmp;
  int iVar7;
  int iVar8;
  char *pcVar9;
  
  if (preferred_pet == 'n') {
    return (monst *)0x0;
  }
  iVar3 = pet_type();
  if (iVar3 == 0x12) {
    pcVar9 = dogname;
    if (dogname[0] == '\0') {
      if (urole.malenum == 0x15b) {
        pcVar9 = "Slasher";
      }
      else {
        pcVar9 = dogname;
      }
      pcVar5 = "Hachi";
      if (urole.malenum != 0x165) {
        pcVar5 = pcVar9;
      }
      pcVar6 = "Idefix";
      if (urole.malenum != 0x15a) {
        pcVar6 = pcVar5;
      }
      pcVar9 = "Sirius";
      if (urole.malenum != 0x163) {
        pcVar9 = pcVar6;
      }
    }
    mtmp = makemon(mons + 0x12,level,(int)u.ux,(int)u.uy,4);
    goto LAB_0016f84c;
  }
  if ((iVar3 == 0x16) || (iVar3 == 0x19)) {
    pcVar9 = wolfname;
  }
  else if (iVar3 == 0x5a) {
    pcVar9 = ratname;
  }
  else if (iVar3 == 0x6b) {
    pcVar9 = horsename;
  }
  else if (iVar3 == 0x152) {
    pcVar9 = crocname;
  }
  else if (iVar3 == 0xef) {
    pcVar9 = monkeyname;
  }
  else {
    pcVar9 = catname;
  }
  if (*pcVar9 == '\0') {
    pcVar5 = "Nicodemus";
    if (urole.malenum != 0x15d) {
      pcVar5 = pcVar9;
    }
    if (iVar3 == 0x5a) {
      pcVar9 = pcVar5;
    }
  }
  mtmp = makemon(mons + iVar3,level,(int)u.ux,(int)u.uy,4);
  if ((iVar3 == 0x16) || (iVar3 == 0x19)) {
LAB_0016f746:
    iVar7 = 1;
    mtmp->m_lev = '\x01';
    for (iVar8 = -1; iVar8 != 0; iVar8 = iVar8 + 1) {
      uVar4 = mt_random();
      iVar7 = iVar7 + (uVar4 & 7);
    }
    mtmp->mhp = iVar7;
    mtmp->mhpmax = iVar7;
    if (iVar3 != 0x6b) goto LAB_0016f84c;
  }
  else if (iVar3 != 0x6b) {
    if ((iVar3 != 0x152) && (iVar3 != 0xef)) goto LAB_0016f84c;
    goto LAB_0016f746;
  }
  otmp = mksobj(level,0xf0,'\x01','\0');
  if (otmp != (obj *)0x0) {
    iVar7 = mpickobj(mtmp,otmp);
    if (iVar7 != 0) {
      panic("merged saddle?");
    }
    pbVar1 = (byte *)((long)&mtmp->misc_worn_check + 2);
    *pbVar1 = *pbVar1 | 0x10;
    otmp->field_0x4a = otmp->field_0x4a | 0xe0;
    otmp->owornmask = 0x100000;
    otmp->corpsenm = mtmp->m_id;
    update_mon_intrinsics(level,mtmp,otmp,'\x01','\x01');
  }
LAB_0016f84c:
  cVar2 = *pcVar9;
  if ((iVar3 == 0x22) && (cVar2 == '\0')) {
    uVar4 = mt_random();
    if ((uVar4 % 100 == 0) && (pcVar9 = "Shiva", (mtmp->field_0x60 & 1) == 0)) {
      pcVar9 = "Kali";
    }
    cVar2 = *pcVar9;
  }
  if (cVar2 != '\0') {
    mtmp = christen_monst(mtmp,pcVar9);
  }
  initedog(mtmp);
  return mtmp;
}

Assistant:

struct monst *makedog(void)
{
	struct monst *mtmp;
	struct obj *otmp;
	const char *petname;
	int   pettype;

	if (preferred_pet == 'n') return NULL;

	pettype = pet_type();
	if (pettype == PM_LITTLE_DOG)
		petname = dogname;
	else if (pettype == PM_PONY)
		petname = horsename;
	else if (pettype == PM_MONKEY)
		petname = monkeyname;
	else if (pettype == PM_WOLF || pettype == PM_WINTER_WOLF_CUB)
		petname = wolfname;
	else if (pettype == PM_BABY_CROCODILE)
		petname = crocname;
	else if (pettype == PM_SEWER_RAT)
		petname = ratname;
	else
		petname = catname;

	/* default pet names */
	if (!*petname) {
	    if (pettype == PM_LITTLE_DOG) {
		/* All of these names were for dogs. */
		if (Role_if(PM_CAVEMAN)) petname = "Slasher";   /* The Warrior */
		if (Role_if(PM_SAMURAI)) petname = "Hachi";     /* Shibuya Station */
		if (Role_if(PM_BARBARIAN)) petname = "Idefix";  /* Obelix */
		if (Role_if(PM_RANGER)) petname = "Sirius";     /* Orion's dog */
	    } else if (pettype == PM_SEWER_RAT) {
		if (Role_if(PM_CONVICT)) petname = "Nicodemus"; /* Rats of NIMH */
	    }
	}

	mtmp = makemon(&mons[pettype], level, u.ux, u.uy, MM_EDOG);

	/* Keep the exotic pets from being higher-level than normal starting
	 * pets.  (makedog is only called once, during game setup, so this
	 * is the place to put it.) */
	if (pettype == PM_WOLF ||
	    pettype == PM_WINTER_WOLF_CUB ||
	    pettype == PM_MONKEY ||
	    pettype == PM_BABY_CROCODILE) {
	    mtmp->m_lev  = 1;
	    mtmp->mhpmax = mtmp->mhp = dice(1,8);
	}

	/* Horses already wear a saddle */
	if (pettype == PM_PONY && !!(otmp = mksobj(level, SADDLE, TRUE, FALSE))) {
	    if (mpickobj(mtmp, otmp))
		panic("merged saddle?");
	    mtmp->misc_worn_check |= W_SADDLE;
	    otmp->dknown = otmp->bknown = otmp->rknown = 1;
	    otmp->owornmask = W_SADDLE;
	    otmp->leashmon = mtmp->m_id;
	    update_mon_intrinsics(level, mtmp, otmp, TRUE, TRUE);
	}

	if (!*petname && pettype == PM_KITTEN && !rn2(100)) {
	    if (mtmp->female) petname = "Shiva"; /* PM: RIP 1 Oct 1998 -  6 Sep 2009 */
	    else petname = "Kali";		 /* PM: RIP 1 May 2000 - 22 Oct 2012 */
	}

	if (*petname)
		mtmp = christen_monst(mtmp, petname);

	initedog(mtmp);
	return mtmp;
}